

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::InvalidateSubDataTest::iterate(InvalidateSubDataTest *this)

{
  ostringstream *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ContextType ctxType;
  deUint32 dVar4;
  undefined4 extraout_var;
  undefined4 *puVar6;
  long lVar7;
  char *description;
  byte bVar8;
  long lVar9;
  GLint max_color_attachments;
  GLuint framebuffer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> color_attachments;
  vector<unsigned_int,_std::allocator<unsigned_int>_> renderbuffers;
  GLuint local_1e8;
  int local_1e4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar5;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    local_1e4 = 0;
    local_1e8 = 8;
    (**(code **)(lVar5 + 0x868))(0x8cdf,&local_1e8);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGetIntegerv has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x7af);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1c8,(long)(int)local_1e8,(allocator_type *)local_1b0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_1e0,(long)(int)local_1e8,(allocator_type *)local_1b0);
    if (0 < (int)local_1e8) {
      lVar7 = 0;
      do {
        local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] = 0;
        local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] = (int)lVar7 + 0x8ce0;
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)local_1e8);
    }
    (**(code **)(lVar5 + 0xc48))(0,3,iterate::default_attachments,0,0,1,1);
    bVar1 = CheckErrorAndLog(this,iterate::default_attachments,3);
    lVar7 = 0;
    do {
      (**(code **)(lVar5 + 0xc48))
                (0,1,(GLenum *)((long)iterate::default_attachments + lVar7),0,0,1,1);
      bVar2 = CheckErrorAndLog(this,*(GLenum *)((long)iterate::default_attachments + lVar7));
      bVar1 = (bool)(bVar1 & bVar2);
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0xc);
    (**(code **)(lVar5 + 0x6d0))(1,&local_1e4);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGenFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x7ca);
    (**(code **)(lVar5 + 0x78))(0x8d40,local_1e4);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glBindFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x7cd);
    (**(code **)(lVar5 + 0x6e8))
              (local_1e8,
               local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"glGenRenderbuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,2000);
    if (0 < (int)local_1e8) {
      lVar7 = 0;
      do {
        (**(code **)(lVar5 + 0xa0))
                  (0x8d41,local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar7]);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glBindRenderbuffer has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x7d6);
        (**(code **)(lVar5 + 0x1238))(0x8d41,0x8814,4,4);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glRenderbufferStorage has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x7d9);
        (**(code **)(lVar5 + 0x688))
                  (0x8d40,(int)lVar7 + 0x8ce0,0x8d41,
                   local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_start[lVar7]);
        dVar4 = (**(code **)(lVar5 + 0x800))();
        glu::checkError(dVar4,"glFramebufferRenderbuffer has failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                        ,0x7dc);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (int)local_1e8);
    }
    iVar3 = (**(code **)(lVar5 + 0x170))(0x8d40);
    if (iVar3 != 0x8cd5) {
      local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Framebuffer is unexpectedly incomplete.",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
      std::ios_base::~ios_base(local_138);
      puVar6 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar6 = 0;
      __cxa_throw(puVar6,&int::typeinfo,0);
    }
    (**(code **)(lVar5 + 0xc48))
              (local_1e4,local_1e8,
               local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,1,1,2,2);
    bVar2 = CheckErrorAndLog(this,local_1e0.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start,local_1e8);
    bVar8 = bVar1 & bVar2;
    if (0 < (int)local_1e8) {
      lVar9 = 0;
      lVar7 = 0;
      do {
        (**(code **)(lVar5 + 0xc48))
                  (local_1e4,1,
                   (long)local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start + lVar9,1,1,2,2);
        bVar1 = CheckErrorAndLog(this,*(GLenum *)
                                       ((long)local_1e0.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start + lVar9));
        bVar8 = bVar8 & bVar1;
        lVar7 = lVar7 + 1;
        lVar9 = lVar9 + 4;
      } while (lVar7 < (int)local_1e8);
    }
    if (local_1e4 != 0) {
      (**(code **)(lVar5 + 0x440))(1);
      local_1e4 = 0;
    }
    if (0 < (int)local_1e8) {
      lVar7 = 0;
      lVar9 = 0;
      do {
        if (*(int *)((long)local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar7) != 0) {
          (**(code **)(lVar5 + 0x460))(1);
        }
        lVar9 = lVar9 + 1;
        lVar7 = lVar7 + 4;
      } while (lVar9 < (int)local_1e8);
    }
    do {
      iVar3 = (**(code **)(lVar5 + 0x800))();
    } while (iVar3 != 0);
    description = "Pass";
    if (bVar8 == 0) {
      description = "Fail";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar8 == 0),
               description);
    if (local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (GLenum *)0x0) {
      operator_delete(local_1e0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1e0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InvalidateSubDataTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Framebuffers' objects */
	glw::GLuint framebuffer = 0;

	/* Get number of color attachments. */
	glw::GLint max_color_attachments = 8 /* Specification minimum OpenGL 4.5 Core Profile p. 627 */;

	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	std::vector<glw::GLuint> renderbuffers(max_color_attachments);
	std::vector<glw::GLuint> color_attachments(max_color_attachments);
	static const glw::GLenum default_attachments[]	 = { GL_COLOR, GL_DEPTH, GL_STENCIL };
	static const glw::GLuint default_attachments_count = sizeof(default_attachments) / sizeof(default_attachments[0]);

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		renderbuffers[i]	 = 0;
		color_attachments[i] = GL_COLOR_ATTACHMENT0 + i;
	}

	try
	{
		/* Invalidate Default Framebuffer data */
		gl.invalidateNamedFramebufferSubData(0, default_attachments_count, &(default_attachments[0]), 0, 0, 1, 1);
		is_ok &= CheckErrorAndLog(default_attachments, default_attachments_count);

		for (glw::GLuint i = 0; i < default_attachments_count; ++i)
		{
			gl.invalidateNamedFramebufferSubData(0, 1, &(default_attachments[i]), 0, 0, 1, 1);
			is_ok &= CheckErrorAndLog(default_attachments[i]);
		}

		/* Prepare framebuffer... */
		gl.genFramebuffers(1, &framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

		gl.genRenderbuffers(max_color_attachments, &(renderbuffers[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

		/* .. with renderbuffer color attachments. */
		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

			gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA32F, 4, 4);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_RENDERBUFFER, renderbuffers[i]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
		}

		/* Check that framebuffer is complete. */
		if (GL_FRAMEBUFFER_COMPLETE != gl.checkFramebufferStatus(GL_FRAMEBUFFER))
		{
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Framebuffer is unexpectedly incomplete."
												<< tcu::TestLog::EndMessage;

			throw 0;
		}

		gl.invalidateNamedFramebufferSubData(framebuffer, max_color_attachments, &(color_attachments[0]), 1, 1, 2, 2);
		is_ok &= CheckErrorAndLog(&(color_attachments[0]), max_color_attachments);

		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			gl.invalidateNamedFramebufferSubData(framebuffer, 1, &(color_attachments[i]), 1, 1, 2, 2);
			is_ok &= CheckErrorAndLog(color_attachments[i]);
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (framebuffer)
	{
		gl.deleteFramebuffers(1, &framebuffer);

		framebuffer = 0;
	}

	for (glw::GLint i = 0; i < max_color_attachments; ++i)
	{
		if (renderbuffers[i])
		{
			gl.deleteRenderbuffers(1, &(renderbuffers[i]));
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}